

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans,char *ept,HelicsError *err)

{
  string_view target;
  Translator *pTVar1;
  HelicsError *in_RDX;
  long in_RSI;
  Translator *translator;
  Translator *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  pTVar1 = getTranslator(in_stack_ffffffffffffffc8,(HelicsError *)in_stack_ffffffffffffffc0);
  if (pTVar1 != (Translator *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      target._M_str = (char *)in_stack_ffffffffffffffd0;
      target._M_len = (size_t)in_stack_ffffffffffffffc8;
      helics::Translator::addDestinationEndpoint(in_stack_ffffffffffffffc0,target);
    }
  }
  return;
}

Assistant:

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans, const char* ept, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(ept, void());
    try {
        translator->addDestinationEndpoint(ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}